

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_ge_scalarmult_base(ge_p3 *h,uint8_t *a)

{
  int iVar1;
  int local_274;
  undefined1 local_270 [4];
  int i;
  ge_precomp t;
  ge_p2 s;
  ge_p1p1 r;
  byte abStack_d8 [7];
  char carry;
  char e [64];
  uint8_t t_1 [4] [32];
  uint8_t *a_local;
  ge_p3 *h_local;
  
  t_1[3]._24_8_ = a;
  iVar1 = CRYPTO_is_BMI1_capable();
  if (((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) &&
     (iVar1 = CRYPTO_is_ADX_capable(), iVar1 != 0)) {
    x25519_ge_scalarmult_base_adx((uint8_t (*) [32])(e + 0x38),(uint8_t *)t_1[3]._24_8_);
    fiat_25519_from_bytes((uint64_t *)h,(uint8_t *)(e + 0x38));
    fiat_25519_from_bytes((h->Y).v,t_1[0] + 0x18);
    fiat_25519_from_bytes((h->Z).v,t_1[1] + 0x18);
    fiat_25519_from_bytes((h->T).v,t_1[2] + 0x18);
    return;
  }
  for (local_274 = 0; local_274 < 0x20; local_274 = local_274 + 1) {
    abStack_d8[local_274 << 1] = *(byte *)(t_1[3]._24_8_ + (long)local_274) & 0xf;
    abStack_d8[local_274 * 2 + 1] =
         (byte)((int)(uint)*(byte *)(t_1[3]._24_8_ + (long)local_274) >> 4);
  }
  r.T.v[4]._7_1_ = '\0';
  for (local_274 = 0; local_274 < 0x3f; local_274 = local_274 + 1) {
    abStack_d8[local_274] = abStack_d8[local_274] + r.T.v[4]._7_1_;
    r.T.v[4]._7_1_ = (char)(abStack_d8[local_274] + 8) >> 4;
    abStack_d8[local_274] = abStack_d8[local_274] + r.T.v[4]._7_1_ * -0x10;
  }
  e[0x37] = e[0x37] + r.T.v[4]._7_1_;
  ge_p3_0(h);
  for (local_274 = 1; local_274 < 0x40; local_274 = local_274 + 2) {
    table_select((ge_precomp *)local_270,local_274 / 2,abStack_d8[local_274]);
    ge_madd((ge_p1p1 *)(s.Z.v + 4),h,(ge_precomp *)local_270);
    x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)(s.Z.v + 4));
  }
  ge_p3_dbl((ge_p1p1 *)(s.Z.v + 4),h);
  x25519_ge_p1p1_to_p2((ge_p2 *)(t.xy2d.v + 4),(ge_p1p1 *)(s.Z.v + 4));
  ge_p2_dbl((ge_p1p1 *)(s.Z.v + 4),(ge_p2 *)(t.xy2d.v + 4));
  x25519_ge_p1p1_to_p2((ge_p2 *)(t.xy2d.v + 4),(ge_p1p1 *)(s.Z.v + 4));
  ge_p2_dbl((ge_p1p1 *)(s.Z.v + 4),(ge_p2 *)(t.xy2d.v + 4));
  x25519_ge_p1p1_to_p2((ge_p2 *)(t.xy2d.v + 4),(ge_p1p1 *)(s.Z.v + 4));
  ge_p2_dbl((ge_p1p1 *)(s.Z.v + 4),(ge_p2 *)(t.xy2d.v + 4));
  x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)(s.Z.v + 4));
  for (local_274 = 0; local_274 < 0x40; local_274 = local_274 + 2) {
    table_select((ge_precomp *)local_270,local_274 / 2,abStack_d8[local_274]);
    ge_madd((ge_p1p1 *)(s.Z.v + 4),h,(ge_precomp *)local_270);
    x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)(s.Z.v + 4));
  }
  return;
}

Assistant:

void x25519_ge_scalarmult_base(ge_p3 *h, const uint8_t a[32]) {
#if defined(BORINGSSL_FE25519_ADX)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    uint8_t t[4][32];
    x25519_ge_scalarmult_base_adx(t, a);
    fiat_25519_from_bytes(h->X.v, t[0]);
    fiat_25519_from_bytes(h->Y.v, t[1]);
    fiat_25519_from_bytes(h->Z.v, t[2]);
    fiat_25519_from_bytes(h->T.v, t[3]);
    return;
  }
#endif
  signed char e[64];
  signed char carry;
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  int i;

  for (i = 0; i < 32; ++i) {
    e[2 * i + 0] = (a[i] >> 0) & 15;
    e[2 * i + 1] = (a[i] >> 4) & 15;
  }
  // each e[i] is between 0 and 15
  // e[63] is between 0 and 7

  carry = 0;
  for (i = 0; i < 63; ++i) {
    e[i] += carry;
    carry = e[i] + 8;
    carry >>= 4;
    e[i] -= carry << 4;
  }
  e[63] += carry;
  // each e[i] is between -8 and 8

  ge_p3_0(h);
  for (i = 1; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }

  ge_p3_dbl(&r, h);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p3(h, &r);

  for (i = 0; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }
}